

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O1

Sexp * Evaluate(Sexp *meaning,Sexp *act)

{
  Sexp *pSVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 local_60;
  Trampoline TStack_58;
  Trampoline result;
  FrameProtector local_28;
  FrameProtector __frame_prot;
  
  FrameProtector::FrameProtector(&local_28,"Evaluate");
  TStack_58.meaning = (Sexp *)CONCAT44(TStack_58.meaning._4_4_,1);
  result._0_8_ = act;
  result.field_1.value = meaning;
  FrameProtector::ProtectValue(&local_28,(Sexp **)&result,"result.value");
  FrameProtector::ProtectValue(&local_28,&result.field_1.value,"result.meaning");
  bVar3 = (int)TStack_58.meaning == 1;
  if (bVar3) {
    uVar2 = result._0_8_;
    do {
      result._0_8_ = uVar2;
      if (*(int *)result._0_8_ != 7) {
        __assert_fail("result.activation->IsActivation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.cpp"
                      ,0x113,"Sexp *Evaluate(Sexp *, Sexp *)");
      }
      if ((result.field_1.value)->kind != MEANING) {
        __assert_fail("result.meaning->IsMeaning()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.cpp"
                      ,0x114,"Sexp *Evaluate(Sexp *, Sexp *)");
      }
      (**(code **)(((result.field_1.value)->field_1).activation)->parent)(&local_60);
      result.field_1 = TStack_58.field_1;
      uVar2._0_4_ = TStack_58.kind;
      uVar2._4_4_ = TStack_58._4_4_;
      TStack_58.meaning = (Sexp *)local_60;
      pSVar1 = TStack_58.meaning;
      result.kind = TStack_58.kind;
      result._4_4_ = TStack_58._4_4_;
      TStack_58.meaning._0_4_ = (int)local_60;
      bVar3 = (int)TStack_58.meaning == 1;
      TStack_58.meaning = pSVar1;
    } while (bVar3);
  }
  uVar2 = result._0_8_;
  FrameProtector::~FrameProtector(&local_28);
  return (Sexp *)uVar2;
}

Assistant:

Sexp *Evaluate(Sexp *meaning, Sexp *act) {
  GC_HELPER_FRAME;

  Trampoline result(act, meaning);

  // important - the activation and value fields in Trampoline
  // have the same memory location, so only one GC_PROTECT
  // is required.
  GC_PROTECT(result.value);
  GC_PROTECT(result.meaning);

  while (result.IsThunk()) {
    assert(result.activation->IsActivation());
    assert(result.meaning->IsMeaning());
    result = result.meaning->meaning->Eval(result.activation);
  }

  return result.value;
}